

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86emithelper.cpp
# Opt level: O1

uint32_t asmjit::v1_14::x86::kmovInstFromSize(uint32_t size)

{
  uint32_t uVar1;
  
  uVar1 = 0;
  if (size - 1 < 8) {
    uVar1 = *(uint32_t *)(&DAT_001593f0 + (ulong)(size - 1) * 4);
  }
  return uVar1;
}

Assistant:

static inline uint32_t kmovInstFromSize(uint32_t size) noexcept {
  switch (size) {
    case  1: return Inst::kIdKmovb;
    case  2: return Inst::kIdKmovw;
    case  4: return Inst::kIdKmovd;
    case  8: return Inst::kIdKmovq;
    default: return Inst::kIdNone;
  }
}